

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<char>(void)

{
  int iVar1;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_23;
  char local_22;
  char local_21;
  char local_20;
  char local_1f;
  char local_1e;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  char local_18;
  char local_17;
  char local_16;
  char local_15;
  SafeInt local_1;
  
  if (ConstCastTestT<char>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::b);
    if (iVar1 != 0) {
      local_1 = (SafeInt)ConstSafeInt<char>();
      ConstCastTestT<char>::b = ::SafeInt::operator_cast_to_bool(&local_1);
      __cxa_guard_release(&ConstCastTestT<char>()::b);
    }
  }
  if (ConstCastTestT<char>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::w);
    if (iVar1 != 0) {
      local_15 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::w =
           ::SafeInt::operator_cast_to_wchar_t
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::w);
    }
  }
  if (ConstCastTestT<char>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::c);
    if (iVar1 != 0) {
      local_16 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::c =
           ::SafeInt::operator_cast_to_char
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::c);
    }
  }
  if (ConstCastTestT<char>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::sc);
    if (iVar1 != 0) {
      local_17 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::sc =
           ::SafeInt::operator_cast_to_signed_char
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::sc);
    }
  }
  if (ConstCastTestT<char>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::uc);
    if (iVar1 != 0) {
      local_18 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::uc =
           ::SafeInt::operator_cast_to_unsigned_char
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::uc);
    }
  }
  if (ConstCastTestT<char>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::s);
    if (iVar1 != 0) {
      local_19 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::s =
           ::SafeInt::operator_cast_to_short
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::s);
    }
  }
  if (ConstCastTestT<char>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::us);
    if (iVar1 != 0) {
      local_1a = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::us =
           ::SafeInt::operator_cast_to_unsigned_short
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::us);
    }
  }
  if (ConstCastTestT<char>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::i);
    if (iVar1 != 0) {
      local_1b = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::i =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::i);
    }
  }
  if (ConstCastTestT<char>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::ui);
    if (iVar1 != 0) {
      local_1c = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::ui =
           ::SafeInt::operator_cast_to_unsigned_int
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::ui);
    }
  }
  if (ConstCastTestT<char>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::l);
    if (iVar1 != 0) {
      local_1d = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::l =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::l);
    }
  }
  if (ConstCastTestT<char>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::ul);
    if (iVar1 != 0) {
      local_1e = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::ul =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::ul);
    }
  }
  if (ConstCastTestT<char>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::ll);
    if (iVar1 != 0) {
      local_1f = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::ll =
           ::SafeInt::operator_cast_to_long_long
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::ll);
    }
  }
  if (ConstCastTestT<char>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::ull);
    if (iVar1 != 0) {
      local_20 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::ull);
    }
  }
  if (ConstCastTestT<char>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::st);
    if (iVar1 != 0) {
      local_21 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::st =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::st);
    }
  }
  if (ConstCastTestT<char>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::pt);
    if (iVar1 != 0) {
      local_22 = (char)ConstSafeInt<char>();
      ConstCastTestT<char>::pt =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::pt);
    }
  }
  if (ConstCastTestT<char>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<char>()::pl);
    if (iVar1 != 0) {
      local_23 = ConstSafeInt<char>();
      uVar2 = CONCAT13(local_23.m_int,(int3)in_stack_ffffffffffffff54);
      SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      operator+(&local_23);
      ConstCastTestT<char>::pl =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(uVar2,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<char>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}